

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Geometry *pGVar5;
  undefined1 auVar6 [32];
  undefined1 (*pauVar7) [16];
  int iVar8;
  AABBNodeMB4D *node1;
  ulong uVar9;
  ulong uVar10;
  RayHitK<8> *pRVar11;
  long lVar12;
  Scene *pSVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  undefined4 uVar19;
  ulong unaff_R12;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  float fVar85;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar91;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar92 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar103;
  float fVar104;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar105;
  float fVar106;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar107 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_13a1;
  ulong local_13a0;
  ulong local_1398;
  Scene *local_1390;
  undefined8 uStack_1388;
  undefined1 local_1380 [16];
  undefined8 local_1370;
  float fStack_1368;
  float fStack_1364;
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  RayHitK<8> *local_1330;
  ulong local_1328;
  undefined1 local_1320 [16];
  ulong local_1310;
  ulong local_1308;
  ulong local_1300;
  ulong local_12f8;
  undefined8 *local_12f0;
  void *local_12e8;
  RTCRayQueryContext *local_12e0;
  RayHitK<8> *local_12d8;
  undefined1 (*local_12d0) [32];
  undefined4 local_12c8;
  undefined1 local_12c0 [16];
  float local_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  undefined1 local_12a0 [16];
  undefined1 local_1290 [16];
  undefined1 *local_1280;
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float local_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float local_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float local_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1160 [16];
  undefined1 local_1150 [16];
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined4 local_1060;
  undefined4 uStack_105c;
  undefined4 uStack_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined4 local_1020;
  undefined4 uStack_101c;
  undefined4 uStack_1018;
  undefined4 uStack_1014;
  undefined4 uStack_1010;
  undefined4 uStack_100c;
  undefined4 uStack_1008;
  undefined4 uStack_1004;
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar18 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar19 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1160._4_4_ = uVar19;
  local_1160._0_4_ = uVar19;
  local_1160._8_4_ = uVar19;
  local_1160._12_4_ = uVar19;
  auVar81 = ZEXT1664(local_1160);
  uVar19 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1170._4_4_ = uVar19;
  local_1170._0_4_ = uVar19;
  local_1170._8_4_ = uVar19;
  local_1170._12_4_ = uVar19;
  auVar83 = ZEXT1664(local_1170);
  uVar19 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1180._4_4_ = uVar19;
  local_1180._0_4_ = uVar19;
  local_1180._8_4_ = uVar19;
  local_1180._12_4_ = uVar19;
  auVar84 = ZEXT1664(local_1180);
  local_11c0 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_11d0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_11e0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1190 = local_11c0 * 0.99999964;
  local_11a0 = local_11d0 * 0.99999964;
  local_11b0 = local_11e0 * 0.99999964;
  local_11c0 = local_11c0 * 1.0000004;
  local_11d0 = local_11d0 * 1.0000004;
  local_11e0 = local_11e0 * 1.0000004;
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1308 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_1310 = uVar14 ^ 0x10;
  local_12f8 = uVar17 ^ 0x10;
  local_1300 = local_1308 ^ 0x10;
  iVar8 = (tray->tnear).field_0.i[k];
  local_12c0._4_4_ = iVar8;
  local_12c0._0_4_ = iVar8;
  local_12c0._8_4_ = iVar8;
  local_12c0._12_4_ = iVar8;
  auVar76 = ZEXT1664(local_12c0);
  iVar8 = (tray->tfar).field_0.i[k];
  auVar31 = ZEXT1664(CONCAT412(iVar8,CONCAT48(iVar8,CONCAT44(iVar8,iVar8))));
  iVar8 = 1 << ((uint)k & 0x1f);
  auVar38._4_4_ = iVar8;
  auVar38._0_4_ = iVar8;
  auVar38._8_4_ = iVar8;
  auVar38._12_4_ = iVar8;
  auVar38._16_4_ = iVar8;
  auVar38._20_4_ = iVar8;
  auVar38._24_4_ = iVar8;
  auVar38._28_4_ = iVar8;
  auVar30 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar38 = vpand_avx2(auVar38,auVar30);
  local_10e0 = vpcmpeqd_avx2(auVar38,auVar30);
  fStack_118c = local_1190;
  fStack_1188 = local_1190;
  fStack_1184 = local_1190;
  fStack_119c = local_11a0;
  fStack_1198 = local_11a0;
  fStack_1194 = local_11a0;
  fStack_11ac = local_11b0;
  fStack_11a8 = local_11b0;
  fStack_11a4 = local_11b0;
  fStack_11bc = local_11c0;
  fStack_11b8 = local_11c0;
  fStack_11b4 = local_11c0;
  fStack_11cc = local_11d0;
  fStack_11c8 = local_11d0;
  fStack_11c4 = local_11d0;
  fStack_11dc = local_11e0;
  fStack_11d8 = local_11e0;
  fStack_11d4 = local_11e0;
  uVar10 = local_1308;
  uVar22 = local_1310;
  fVar85 = local_1190;
  fVar88 = local_1190;
  fVar89 = local_1190;
  fVar90 = local_1190;
  fVar91 = local_11a0;
  fVar93 = local_11a0;
  fVar94 = local_11a0;
  fVar95 = local_11a0;
  fVar96 = local_11b0;
  fVar97 = local_11b0;
  fVar98 = local_11b0;
  fVar99 = local_11b0;
  fVar100 = local_11c0;
  fVar103 = local_11c0;
  fVar104 = local_11c0;
  fVar105 = local_11c0;
  fVar106 = local_11d0;
  fVar108 = local_11d0;
  fVar109 = local_11d0;
  fVar110 = local_11d0;
  fVar111 = local_11e0;
  fVar112 = local_11e0;
  fVar113 = local_11e0;
  fVar114 = local_11e0;
  local_13a0 = uVar17;
  local_1398 = uVar14;
  local_1330 = ray;
  do {
    do {
      do {
        if (pauVar18 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar7 = pauVar18 + -1;
        pauVar18 = pauVar18 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar7 + 8));
      uVar21 = *(ulong *)*pauVar18;
      do {
        if ((uVar21 & 8) == 0) {
          uVar9 = uVar21 & 0xfffffffffffffff0;
          uVar19 = *(undefined4 *)(ray + k * 4 + 0xe0);
          auVar32._4_4_ = uVar19;
          auVar32._0_4_ = uVar19;
          auVar32._8_4_ = uVar19;
          auVar32._12_4_ = uVar19;
          auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar9 + 0x80 + uVar14),auVar32,
                                    *(undefined1 (*) [16])(uVar9 + 0x20 + uVar14));
          auVar34 = vsubps_avx(auVar34,auVar81._0_16_);
          auVar33._0_4_ = fVar85 * auVar34._0_4_;
          auVar33._4_4_ = fVar88 * auVar34._4_4_;
          auVar33._8_4_ = fVar89 * auVar34._8_4_;
          auVar33._12_4_ = fVar90 * auVar34._12_4_;
          auVar34 = vmaxps_avx(auVar76._0_16_,auVar33);
          auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar9 + 0x80 + uVar17),auVar32,
                                    *(undefined1 (*) [16])(uVar9 + 0x20 + uVar17));
          auVar33 = vsubps_avx(auVar33,auVar83._0_16_);
          auVar47._0_4_ = fVar91 * auVar33._0_4_;
          auVar47._4_4_ = fVar93 * auVar33._4_4_;
          auVar47._8_4_ = fVar94 * auVar33._8_4_;
          auVar47._12_4_ = fVar95 * auVar33._12_4_;
          auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar9 + 0x80 + uVar10),auVar32,
                                    *(undefined1 (*) [16])(uVar9 + 0x20 + uVar10));
          auVar33 = vsubps_avx(auVar33,auVar84._0_16_);
          auVar55._0_4_ = fVar96 * auVar33._0_4_;
          auVar55._4_4_ = fVar97 * auVar33._4_4_;
          auVar55._8_4_ = fVar98 * auVar33._8_4_;
          auVar55._12_4_ = fVar99 * auVar33._12_4_;
          auVar33 = vmaxps_avx(auVar47,auVar55);
          auVar34 = vmaxps_avx(auVar34,auVar33);
          auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar9 + 0x80 + uVar22),auVar32,
                                    *(undefined1 (*) [16])(uVar9 + 0x20 + uVar22));
          auVar33 = vsubps_avx(auVar33,auVar81._0_16_);
          auVar48._0_4_ = fVar100 * auVar33._0_4_;
          auVar48._4_4_ = fVar103 * auVar33._4_4_;
          auVar48._8_4_ = fVar104 * auVar33._8_4_;
          auVar48._12_4_ = fVar105 * auVar33._12_4_;
          auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar9 + 0x80 + local_12f8),auVar32,
                                    *(undefined1 (*) [16])(uVar9 + 0x20 + local_12f8));
          auVar33 = vsubps_avx(auVar33,auVar83._0_16_);
          auVar56._0_4_ = fVar106 * auVar33._0_4_;
          auVar56._4_4_ = fVar108 * auVar33._4_4_;
          auVar56._8_4_ = fVar109 * auVar33._8_4_;
          auVar56._12_4_ = fVar110 * auVar33._12_4_;
          auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar9 + 0x80 + local_1300),auVar32,
                                    *(undefined1 (*) [16])(uVar9 + 0x20 + local_1300));
          auVar33 = vsubps_avx(auVar33,auVar84._0_16_);
          auVar65._0_4_ = fVar111 * auVar33._0_4_;
          auVar65._4_4_ = fVar112 * auVar33._4_4_;
          auVar65._8_4_ = fVar113 * auVar33._8_4_;
          auVar65._12_4_ = fVar114 * auVar33._12_4_;
          auVar33 = vminps_avx(auVar56,auVar65);
          auVar47 = vminps_avx(auVar31._0_16_,auVar48);
          auVar33 = vminps_avx(auVar47,auVar33);
          if (((uint)uVar21 & 7) == 6) {
            auVar47 = vcmpps_avx(auVar34,auVar33,2);
            auVar33 = vcmpps_avx(*(undefined1 (*) [16])(uVar9 + 0xe0),auVar32,2);
            auVar32 = vcmpps_avx(auVar32,*(undefined1 (*) [16])(uVar9 + 0xf0),1);
            auVar33 = vandps_avx(auVar33,auVar32);
            auVar33 = vandps_avx(auVar33,auVar47);
          }
          else {
            auVar33 = vcmpps_avx(auVar34,auVar33,2);
          }
          auVar33 = vpslld_avx(auVar33,0x1f);
          uVar19 = vmovmskps_avx(auVar33);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar19);
          local_10c0._0_16_ = auVar34;
        }
        if ((uVar21 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar8 = 4;
          }
          else {
            uVar9 = uVar21 & 0xfffffffffffffff0;
            lVar12 = 0;
            for (uVar21 = unaff_R12; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              lVar12 = lVar12 + 1;
            }
            iVar8 = 0;
            uVar15 = unaff_R12 - 1 & unaff_R12;
            uVar21 = *(ulong *)(uVar9 + lVar12 * 8);
            if (uVar15 != 0) {
              uVar3 = *(uint *)(local_10c0 + lVar12 * 4);
              lVar12 = 0;
              for (uVar14 = uVar15; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                lVar12 = lVar12 + 1;
              }
              uVar15 = uVar15 - 1 & uVar15;
              uVar4 = *(ulong *)(uVar9 + lVar12 * 8);
              uVar2 = *(uint *)(local_10c0 + lVar12 * 4);
              uVar14 = local_1398;
              uVar17 = local_13a0;
              if (uVar15 == 0) {
                if (uVar3 < uVar2) {
                  *(ulong *)*pauVar18 = uVar4;
                  *(uint *)(*pauVar18 + 8) = uVar2;
                  pauVar18 = pauVar18 + 1;
                }
                else {
                  *(ulong *)*pauVar18 = uVar21;
                  *(uint *)(*pauVar18 + 8) = uVar3;
                  pauVar18 = pauVar18 + 1;
                  uVar21 = uVar4;
                }
              }
              else {
                auVar34._8_8_ = 0;
                auVar34._0_8_ = uVar21;
                auVar34 = vpunpcklqdq_avx(auVar34,ZEXT416(uVar3));
                auVar40._8_8_ = 0;
                auVar40._0_8_ = uVar4;
                auVar33 = vpunpcklqdq_avx(auVar40,ZEXT416(uVar2));
                lVar12 = 0;
                for (uVar21 = uVar15; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000)
                {
                  lVar12 = lVar12 + 1;
                }
                uVar15 = uVar15 - 1 & uVar15;
                auVar49._8_8_ = 0;
                auVar49._0_8_ = *(ulong *)(uVar9 + lVar12 * 8);
                auVar32 = vpunpcklqdq_avx(auVar49,ZEXT416(*(uint *)(local_10c0 + lVar12 * 4)));
                auVar47 = vpcmpgtd_avx(auVar33,auVar34);
                if (uVar15 == 0) {
                  auVar48 = vpshufd_avx(auVar47,0xaa);
                  auVar47 = vblendvps_avx(auVar33,auVar34,auVar48);
                  auVar34 = vblendvps_avx(auVar34,auVar33,auVar48);
                  auVar33 = vpcmpgtd_avx(auVar32,auVar47);
                  auVar48 = vpshufd_avx(auVar33,0xaa);
                  auVar33 = vblendvps_avx(auVar32,auVar47,auVar48);
                  auVar47 = vblendvps_avx(auVar47,auVar32,auVar48);
                  auVar32 = vpcmpgtd_avx(auVar47,auVar34);
                  auVar48 = vpshufd_avx(auVar32,0xaa);
                  auVar32 = vblendvps_avx(auVar47,auVar34,auVar48);
                  auVar34 = vblendvps_avx(auVar34,auVar47,auVar48);
                  *pauVar18 = auVar34;
                  pauVar18[1] = auVar32;
                  uVar21 = auVar33._0_8_;
                  pauVar18 = pauVar18 + 2;
                }
                else {
                  lVar12 = 0;
                  for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                    lVar12 = lVar12 + 1;
                  }
                  auVar66._8_8_ = 0;
                  auVar66._0_8_ = *(ulong *)(uVar9 + lVar12 * 8);
                  auVar55 = vpunpcklqdq_avx(auVar66,ZEXT416(*(uint *)(local_10c0 + lVar12 * 4)));
                  auVar48 = vpshufd_avx(auVar47,0xaa);
                  auVar47 = vblendvps_avx(auVar33,auVar34,auVar48);
                  auVar34 = vblendvps_avx(auVar34,auVar33,auVar48);
                  auVar33 = vpcmpgtd_avx(auVar55,auVar32);
                  auVar48 = vpshufd_avx(auVar33,0xaa);
                  auVar33 = vblendvps_avx(auVar55,auVar32,auVar48);
                  auVar32 = vblendvps_avx(auVar32,auVar55,auVar48);
                  auVar48 = vpcmpgtd_avx(auVar32,auVar34);
                  auVar55 = vpshufd_avx(auVar48,0xaa);
                  auVar48 = vblendvps_avx(auVar32,auVar34,auVar55);
                  auVar34 = vblendvps_avx(auVar34,auVar32,auVar55);
                  auVar32 = vpcmpgtd_avx(auVar33,auVar47);
                  auVar55 = vpshufd_avx(auVar32,0xaa);
                  auVar32 = vblendvps_avx(auVar33,auVar47,auVar55);
                  auVar33 = vblendvps_avx(auVar47,auVar33,auVar55);
                  auVar47 = vpcmpgtd_avx(auVar48,auVar33);
                  auVar55 = vpshufd_avx(auVar47,0xaa);
                  auVar47 = vblendvps_avx(auVar48,auVar33,auVar55);
                  auVar33 = vblendvps_avx(auVar33,auVar48,auVar55);
                  *pauVar18 = auVar34;
                  pauVar18[1] = auVar33;
                  pauVar18[2] = auVar47;
                  auVar76 = ZEXT1664(local_12c0);
                  uVar21 = auVar32._0_8_;
                  pauVar18 = pauVar18 + 3;
                }
              }
            }
          }
        }
        else {
          iVar8 = 6;
        }
      } while (iVar8 == 0);
    } while (iVar8 != 6);
    lVar12 = (ulong)((uint)uVar21 & 0xf) - 8;
    if (lVar12 != 0) {
      uVar21 = uVar21 & 0xfffffffffffffff0;
      lVar16 = 0;
      local_1328 = unaff_R12;
      do {
        lVar23 = lVar16 * 0x140;
        uVar19 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar57._4_4_ = uVar19;
        auVar57._0_4_ = uVar19;
        auVar57._8_4_ = uVar19;
        auVar57._12_4_ = uVar19;
        auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x90 + lVar23),auVar57,
                                  *(undefined1 (*) [16])(uVar21 + lVar23));
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xa0 + lVar23),auVar57,
                                  *(undefined1 (*) [16])(uVar21 + 0x10 + lVar23));
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xb0 + lVar23),auVar57,
                                  *(undefined1 (*) [16])(uVar21 + 0x20 + lVar23));
        auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xc0 + lVar23),auVar57,
                                  *(undefined1 (*) [16])(uVar21 + 0x30 + lVar23));
        auVar55 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xd0 + lVar23),auVar57,
                                  *(undefined1 (*) [16])(uVar21 + 0x40 + lVar23));
        auVar56 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xe0 + lVar23),auVar57,
                                  *(undefined1 (*) [16])(uVar21 + 0x50 + lVar23));
        auVar65 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0xf0 + lVar23),auVar57,
                                  *(undefined1 (*) [16])(uVar21 + 0x60 + lVar23));
        auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x100 + lVar23),auVar57,
                                  *(undefined1 (*) [16])(uVar21 + 0x70 + lVar23));
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar21 + 0x110 + lVar23),auVar57,
                                  *(undefined1 (*) [16])(uVar21 + 0x80 + lVar23));
        uVar19 = *(undefined4 *)(ray + k * 4);
        auVar58._4_4_ = uVar19;
        auVar58._0_4_ = uVar19;
        auVar58._8_4_ = uVar19;
        auVar58._12_4_ = uVar19;
        uVar19 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar101._4_4_ = uVar19;
        auVar101._0_4_ = uVar19;
        auVar101._8_4_ = uVar19;
        auVar101._12_4_ = uVar19;
        uVar19 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar107._4_4_ = uVar19;
        auVar107._0_4_ = uVar19;
        auVar107._8_4_ = uVar19;
        auVar107._12_4_ = uVar19;
        auVar47 = vsubps_avx(auVar34,auVar58);
        local_1360 = vsubps_avx(auVar33,auVar101);
        local_1320 = vsubps_avx(auVar32,auVar107);
        auVar34 = vsubps_avx(auVar48,auVar58);
        auVar33 = vsubps_avx(auVar55,auVar101);
        auVar32 = vsubps_avx(auVar56,auVar107);
        auVar48 = vsubps_avx(auVar65,auVar58);
        auVar55 = vsubps_avx(auVar40,auVar101);
        auVar56 = vsubps_avx(auVar49,auVar107);
        local_10f0 = vsubps_avx(auVar48,auVar47);
        local_1110 = vsubps_avx(auVar55,local_1360);
        local_1100 = vsubps_avx(auVar56,local_1320);
        auVar24._0_4_ = auVar48._0_4_ + auVar47._0_4_;
        auVar24._4_4_ = auVar48._4_4_ + auVar47._4_4_;
        auVar24._8_4_ = auVar48._8_4_ + auVar47._8_4_;
        auVar24._12_4_ = auVar48._12_4_ + auVar47._12_4_;
        auVar50._0_4_ = auVar55._0_4_ + local_1360._0_4_;
        auVar50._4_4_ = auVar55._4_4_ + local_1360._4_4_;
        auVar50._8_4_ = auVar55._8_4_ + local_1360._8_4_;
        auVar50._12_4_ = auVar55._12_4_ + local_1360._12_4_;
        fVar85 = local_1320._0_4_;
        auVar59._0_4_ = auVar56._0_4_ + fVar85;
        fVar88 = local_1320._4_4_;
        auVar59._4_4_ = auVar56._4_4_ + fVar88;
        fVar89 = local_1320._8_4_;
        auVar59._8_4_ = auVar56._8_4_ + fVar89;
        fVar90 = local_1320._12_4_;
        auVar59._12_4_ = auVar56._12_4_ + fVar90;
        auVar102._0_4_ = auVar50._0_4_ * local_1100._0_4_;
        auVar102._4_4_ = auVar50._4_4_ * local_1100._4_4_;
        auVar102._8_4_ = auVar50._8_4_ * local_1100._8_4_;
        auVar102._12_4_ = auVar50._12_4_ * local_1100._12_4_;
        auVar40 = vfmsub231ps_fma(auVar102,local_1110,auVar59);
        auVar60._0_4_ = auVar59._0_4_ * local_10f0._0_4_;
        auVar60._4_4_ = auVar59._4_4_ * local_10f0._4_4_;
        auVar60._8_4_ = auVar59._8_4_ * local_10f0._8_4_;
        auVar60._12_4_ = auVar59._12_4_ * local_10f0._12_4_;
        auVar65 = vfmsub231ps_fma(auVar60,local_1100,auVar24);
        auVar25._0_4_ = local_1110._0_4_ * auVar24._0_4_;
        auVar25._4_4_ = local_1110._4_4_ * auVar24._4_4_;
        auVar25._8_4_ = local_1110._8_4_ * auVar24._8_4_;
        auVar25._12_4_ = local_1110._12_4_ * auVar24._12_4_;
        auVar49 = vfmsub231ps_fma(auVar25,local_10f0,auVar50);
        local_1370._4_4_ = *(float *)(ray + k * 4 + 0xc0);
        auVar82._0_4_ = local_1370._4_4_ * auVar49._0_4_;
        auVar82._4_4_ = local_1370._4_4_ * auVar49._4_4_;
        auVar82._8_4_ = local_1370._4_4_ * auVar49._8_4_;
        auVar82._12_4_ = local_1370._4_4_ * auVar49._12_4_;
        uVar19 = *(undefined4 *)(ray + k * 4 + 0xa0);
        auVar92._4_4_ = uVar19;
        auVar92._0_4_ = uVar19;
        auVar92._8_4_ = uVar19;
        auVar92._12_4_ = uVar19;
        auVar65 = vfmadd231ps_fma(auVar82,auVar92,auVar65);
        uVar19 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_1380._4_4_ = uVar19;
        local_1380._0_4_ = uVar19;
        local_1380._8_4_ = uVar19;
        local_1380._12_4_ = uVar19;
        local_1140 = vfmadd231ps_fma(auVar65,local_1380,auVar40);
        local_1120 = vsubps_avx(local_1360,auVar33);
        local_1130 = vsubps_avx(local_1320,auVar32);
        auVar51._0_4_ = local_1360._0_4_ + auVar33._0_4_;
        auVar51._4_4_ = local_1360._4_4_ + auVar33._4_4_;
        auVar51._8_4_ = local_1360._8_4_ + auVar33._8_4_;
        auVar51._12_4_ = local_1360._12_4_ + auVar33._12_4_;
        auVar61._0_4_ = fVar85 + auVar32._0_4_;
        auVar61._4_4_ = fVar88 + auVar32._4_4_;
        auVar61._8_4_ = fVar89 + auVar32._8_4_;
        auVar61._12_4_ = fVar90 + auVar32._12_4_;
        fVar91 = local_1130._0_4_;
        auVar70._0_4_ = auVar51._0_4_ * fVar91;
        fVar94 = local_1130._4_4_;
        auVar70._4_4_ = auVar51._4_4_ * fVar94;
        fVar96 = local_1130._8_4_;
        auVar70._8_4_ = auVar51._8_4_ * fVar96;
        fVar98 = local_1130._12_4_;
        auVar70._12_4_ = auVar51._12_4_ * fVar98;
        auVar49 = vfmsub231ps_fma(auVar70,local_1120,auVar61);
        auVar65 = vsubps_avx(auVar47,auVar34);
        fVar93 = auVar65._0_4_;
        auVar77._0_4_ = auVar61._0_4_ * fVar93;
        fVar95 = auVar65._4_4_;
        auVar77._4_4_ = auVar61._4_4_ * fVar95;
        fVar97 = auVar65._8_4_;
        auVar77._8_4_ = auVar61._8_4_ * fVar97;
        fVar99 = auVar65._12_4_;
        auVar77._12_4_ = auVar61._12_4_ * fVar99;
        auVar62._0_4_ = auVar47._0_4_ + auVar34._0_4_;
        auVar62._4_4_ = auVar47._4_4_ + auVar34._4_4_;
        auVar62._8_4_ = auVar47._8_4_ + auVar34._8_4_;
        auVar62._12_4_ = auVar47._12_4_ + auVar34._12_4_;
        auVar40 = vfmsub231ps_fma(auVar77,local_1130,auVar62);
        fVar100 = local_1120._0_4_;
        auVar63._0_4_ = fVar100 * auVar62._0_4_;
        fVar103 = local_1120._4_4_;
        auVar63._4_4_ = fVar103 * auVar62._4_4_;
        fVar104 = local_1120._8_4_;
        auVar63._8_4_ = fVar104 * auVar62._8_4_;
        fVar105 = local_1120._12_4_;
        auVar63._12_4_ = fVar105 * auVar62._12_4_;
        auVar66 = vfmsub231ps_fma(auVar63,auVar65,auVar51);
        auVar64._0_4_ = local_1370._4_4_ * auVar66._0_4_;
        auVar64._4_4_ = local_1370._4_4_ * auVar66._4_4_;
        auVar64._8_4_ = local_1370._4_4_ * auVar66._8_4_;
        auVar64._12_4_ = local_1370._4_4_ * auVar66._12_4_;
        auVar40 = vfmadd231ps_fma(auVar64,auVar92,auVar40);
        local_12a0 = vfmadd231ps_fma(auVar40,local_1380,auVar49);
        auVar40 = vsubps_avx(auVar34,auVar48);
        auVar41._0_4_ = auVar34._0_4_ + auVar48._0_4_;
        auVar41._4_4_ = auVar34._4_4_ + auVar48._4_4_;
        auVar41._8_4_ = auVar34._8_4_ + auVar48._8_4_;
        auVar41._12_4_ = auVar34._12_4_ + auVar48._12_4_;
        auVar48 = vsubps_avx(auVar33,auVar55);
        auVar35._0_4_ = auVar33._0_4_ + auVar55._0_4_;
        auVar35._4_4_ = auVar33._4_4_ + auVar55._4_4_;
        auVar35._8_4_ = auVar33._8_4_ + auVar55._8_4_;
        auVar35._12_4_ = auVar33._12_4_ + auVar55._12_4_;
        auVar55 = vsubps_avx(auVar32,auVar56);
        auVar67._0_4_ = auVar32._0_4_ + auVar56._0_4_;
        auVar67._4_4_ = auVar32._4_4_ + auVar56._4_4_;
        auVar67._8_4_ = auVar32._8_4_ + auVar56._8_4_;
        auVar67._12_4_ = auVar32._12_4_ + auVar56._12_4_;
        auVar71._0_4_ = auVar55._0_4_ * auVar35._0_4_;
        auVar71._4_4_ = auVar55._4_4_ * auVar35._4_4_;
        auVar71._8_4_ = auVar55._8_4_ * auVar35._8_4_;
        auVar71._12_4_ = auVar55._12_4_ * auVar35._12_4_;
        auVar33 = vfmsub231ps_fma(auVar71,auVar48,auVar67);
        auVar68._0_4_ = auVar67._0_4_ * auVar40._0_4_;
        auVar68._4_4_ = auVar67._4_4_ * auVar40._4_4_;
        auVar68._8_4_ = auVar67._8_4_ * auVar40._8_4_;
        auVar68._12_4_ = auVar67._12_4_ * auVar40._12_4_;
        auVar34 = vfmsub231ps_fma(auVar68,auVar55,auVar41);
        auVar42._0_4_ = auVar48._0_4_ * auVar41._0_4_;
        auVar42._4_4_ = auVar48._4_4_ * auVar41._4_4_;
        auVar42._8_4_ = auVar48._8_4_ * auVar41._8_4_;
        auVar42._12_4_ = auVar48._12_4_ * auVar41._12_4_;
        auVar32 = vfmsub231ps_fma(auVar42,auVar40,auVar35);
        local_1370._0_4_ = local_1370._4_4_;
        fStack_1368 = local_1370._4_4_;
        fStack_1364 = local_1370._4_4_;
        auVar43._0_4_ = local_1370._4_4_ * auVar32._0_4_;
        auVar43._4_4_ = local_1370._4_4_ * auVar32._4_4_;
        auVar43._8_4_ = local_1370._4_4_ * auVar32._8_4_;
        auVar43._12_4_ = local_1370._4_4_ * auVar32._12_4_;
        auVar34 = vfmadd231ps_fma(auVar43,auVar92,auVar34);
        auVar32 = vfmadd231ps_fma(auVar34,local_1380,auVar33);
        local_12b0 = local_1140._0_4_;
        fStack_12ac = local_1140._4_4_;
        fStack_12a8 = local_1140._8_4_;
        fStack_12a4 = local_1140._12_4_;
        local_1290._0_4_ = auVar32._0_4_ + local_12b0 + local_12a0._0_4_;
        local_1290._4_4_ = auVar32._4_4_ + fStack_12ac + local_12a0._4_4_;
        local_1290._8_4_ = auVar32._8_4_ + fStack_12a8 + local_12a0._8_4_;
        local_1290._12_4_ = auVar32._12_4_ + fStack_12a4 + local_12a0._12_4_;
        auVar36._8_4_ = 0x7fffffff;
        auVar36._0_8_ = 0x7fffffff7fffffff;
        auVar36._12_4_ = 0x7fffffff;
        auVar34 = vminps_avx(local_1140,local_12a0);
        auVar34 = vminps_avx(auVar34,auVar32);
        local_1150 = vandps_avx(local_1290,auVar36);
        auVar78._0_4_ = local_1150._0_4_ * 1.1920929e-07;
        auVar78._4_4_ = local_1150._4_4_ * 1.1920929e-07;
        auVar78._8_4_ = local_1150._8_4_ * 1.1920929e-07;
        auVar78._12_4_ = local_1150._12_4_ * 1.1920929e-07;
        uVar10 = CONCAT44(auVar78._4_4_,auVar78._0_4_);
        auVar72._0_8_ = uVar10 ^ 0x8000000080000000;
        auVar72._8_4_ = -auVar78._8_4_;
        auVar72._12_4_ = -auVar78._12_4_;
        auVar34 = vcmpps_avx(auVar34,auVar72,5);
        auVar33 = vmaxps_avx(local_1140,local_12a0);
        auVar33 = vmaxps_avx(auVar33,auVar32);
        auVar33 = vcmpps_avx(auVar33,auVar78,2);
        auVar34 = vorps_avx(auVar34,auVar33);
        if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar34[0xf] < '\0') {
          auVar44._0_4_ = local_1100._0_4_ * fVar100;
          auVar44._4_4_ = local_1100._4_4_ * fVar103;
          auVar44._8_4_ = local_1100._8_4_ * fVar104;
          auVar44._12_4_ = local_1100._12_4_ * fVar105;
          auVar73._0_4_ = fVar93 * local_1110._0_4_;
          auVar73._4_4_ = fVar95 * local_1110._4_4_;
          auVar73._8_4_ = fVar97 * local_1110._8_4_;
          auVar73._12_4_ = fVar99 * local_1110._12_4_;
          auVar56 = vfmsub213ps_fma(local_1110,local_1130,auVar44);
          auVar69._0_4_ = auVar48._0_4_ * fVar91;
          auVar69._4_4_ = auVar48._4_4_ * fVar94;
          auVar69._8_4_ = auVar48._8_4_ * fVar96;
          auVar69._12_4_ = auVar48._12_4_ * fVar98;
          auVar79._0_4_ = fVar93 * auVar55._0_4_;
          auVar79._4_4_ = fVar95 * auVar55._4_4_;
          auVar79._8_4_ = fVar97 * auVar55._8_4_;
          auVar79._12_4_ = fVar99 * auVar55._12_4_;
          auVar55 = vfmsub213ps_fma(auVar55,local_1120,auVar69);
          auVar33 = vandps_avx(auVar44,auVar36);
          auVar32 = vandps_avx(auVar69,auVar36);
          auVar33 = vcmpps_avx(auVar33,auVar32,1);
          local_1230 = vblendvps_avx(auVar55,auVar56,auVar33);
          auVar86._0_4_ = auVar40._0_4_ * fVar100;
          auVar86._4_4_ = auVar40._4_4_ * fVar103;
          auVar86._8_4_ = auVar40._8_4_ * fVar104;
          auVar86._12_4_ = auVar40._12_4_ * fVar105;
          auVar55 = vfmsub213ps_fma(auVar40,local_1130,auVar79);
          auVar45._0_4_ = local_10f0._0_4_ * fVar91;
          auVar45._4_4_ = local_10f0._4_4_ * fVar94;
          auVar45._8_4_ = local_10f0._8_4_ * fVar96;
          auVar45._12_4_ = local_10f0._12_4_ * fVar98;
          auVar56 = vfmsub213ps_fma(local_1100,auVar65,auVar45);
          auVar33 = vandps_avx(auVar45,auVar36);
          auVar32 = vandps_avx(auVar79,auVar36);
          auVar33 = vcmpps_avx(auVar33,auVar32,1);
          local_1220 = vblendvps_avx(auVar55,auVar56,auVar33);
          auVar55 = vfmsub213ps_fma(local_10f0,local_1120,auVar73);
          auVar48 = vfmsub213ps_fma(auVar48,auVar65,auVar86);
          auVar33 = vandps_avx(auVar73,auVar36);
          auVar32 = vandps_avx(auVar86,auVar36);
          auVar33 = vcmpps_avx(auVar33,auVar32,1);
          local_1210 = vblendvps_avx(auVar48,auVar55,auVar33);
          auVar52._0_4_ = local_1210._0_4_ * local_1370._4_4_;
          auVar52._4_4_ = local_1210._4_4_ * local_1370._4_4_;
          auVar52._8_4_ = local_1210._8_4_ * local_1370._4_4_;
          auVar52._12_4_ = local_1210._12_4_ * local_1370._4_4_;
          auVar33 = vfmadd213ps_fma(auVar92,local_1220,auVar52);
          auVar33 = vfmadd213ps_fma(local_1380,local_1230,auVar33);
          auVar53._0_4_ = auVar33._0_4_ + auVar33._0_4_;
          auVar53._4_4_ = auVar33._4_4_ + auVar33._4_4_;
          auVar53._8_4_ = auVar33._8_4_ + auVar33._8_4_;
          auVar53._12_4_ = auVar33._12_4_ + auVar33._12_4_;
          auVar74._0_4_ = local_1210._0_4_ * fVar85;
          auVar74._4_4_ = local_1210._4_4_ * fVar88;
          auVar74._8_4_ = local_1210._8_4_ * fVar89;
          auVar74._12_4_ = local_1210._12_4_ * fVar90;
          auVar33 = vfmadd213ps_fma(local_1360,local_1220,auVar74);
          auVar47 = vfmadd213ps_fma(auVar47,local_1230,auVar33);
          auVar33 = vrcpps_avx(auVar53);
          auVar87._8_4_ = 0x3f800000;
          auVar87._0_8_ = &DAT_3f8000003f800000;
          auVar87._12_4_ = 0x3f800000;
          auVar32 = vfnmadd213ps_fma(auVar33,auVar53,auVar87);
          auVar33 = vfmadd132ps_fma(auVar32,auVar33,auVar33);
          local_1240._0_4_ = auVar33._0_4_ * (auVar47._0_4_ + auVar47._0_4_);
          local_1240._4_4_ = auVar33._4_4_ * (auVar47._4_4_ + auVar47._4_4_);
          local_1240._8_4_ = auVar33._8_4_ * (auVar47._8_4_ + auVar47._8_4_);
          local_1240._12_4_ = auVar33._12_4_ * (auVar47._12_4_ + auVar47._12_4_);
          auVar31 = ZEXT1664(local_1240);
          uVar19 = *(undefined4 *)(ray + k * 4 + 0x60);
          auVar75._4_4_ = uVar19;
          auVar75._0_4_ = uVar19;
          auVar75._8_4_ = uVar19;
          auVar75._12_4_ = uVar19;
          auVar33 = vcmpps_avx(auVar75,local_1240,2);
          uVar19 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar80._4_4_ = uVar19;
          auVar80._0_4_ = uVar19;
          auVar80._8_4_ = uVar19;
          auVar80._12_4_ = uVar19;
          auVar47 = vcmpps_avx(local_1240,auVar80,2);
          auVar33 = vandps_avx(auVar33,auVar47);
          auVar32 = auVar34 & auVar33;
          if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar32[0xf] < '\0') {
            auVar34 = vandps_avx(auVar34,auVar33);
            auVar33 = vcmpps_avx(auVar53,_DAT_01feba10,4);
            auVar32 = auVar33 & auVar34;
            if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar32[0xf] < '\0') {
              local_1340 = vandps_avx(auVar34,auVar33);
              local_1280 = &local_13a1;
              pSVar13 = context->scene;
              auVar34 = vrcpps_avx(local_1290);
              auVar54._8_4_ = 0x3f800000;
              auVar54._0_8_ = &DAT_3f8000003f800000;
              auVar54._12_4_ = 0x3f800000;
              auVar33 = vfnmadd213ps_fma(local_1290,auVar34,auVar54);
              auVar33 = vfmadd132ps_fma(auVar33,auVar34,auVar34);
              auVar46._8_4_ = 0x219392ef;
              auVar46._0_8_ = 0x219392ef219392ef;
              auVar46._12_4_ = 0x219392ef;
              auVar34 = vcmpps_avx(local_1150,auVar46,5);
              auVar34 = vandps_avx(auVar33,auVar34);
              auVar26._0_4_ = local_12b0 * auVar34._0_4_;
              auVar26._4_4_ = fStack_12ac * auVar34._4_4_;
              auVar26._8_4_ = fStack_12a8 * auVar34._8_4_;
              auVar26._12_4_ = fStack_12a4 * auVar34._12_4_;
              local_1260 = vminps_avx(auVar26,auVar54);
              auVar27._0_4_ = auVar34._0_4_ * local_12a0._0_4_;
              auVar27._4_4_ = auVar34._4_4_ * local_12a0._4_4_;
              auVar27._8_4_ = auVar34._8_4_ * local_12a0._8_4_;
              auVar27._12_4_ = auVar34._12_4_ * local_12a0._12_4_;
              local_1250 = vminps_avx(auVar27,auVar54);
              auVar28._8_4_ = 0x7f800000;
              auVar28._0_8_ = 0x7f8000007f800000;
              auVar28._12_4_ = 0x7f800000;
              auVar34 = vblendvps_avx(auVar28,local_1240,local_1340);
              auVar33 = vshufps_avx(auVar34,auVar34,0xb1);
              auVar33 = vminps_avx(auVar33,auVar34);
              auVar32 = vshufpd_avx(auVar33,auVar33,1);
              auVar33 = vminps_avx(auVar32,auVar33);
              auVar33 = vcmpps_avx(auVar34,auVar33,0);
              auVar32 = local_1340 & auVar33;
              auVar34 = local_1340;
              if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar32 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar32 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar32[0xf] < '\0') {
                auVar34 = vandps_avx(auVar33,local_1340);
              }
              lVar23 = lVar23 + uVar21;
              uVar19 = vmovmskps_avx(auVar34);
              lVar20 = 0;
              for (uVar10 = CONCAT44((int)((ulong)local_1280 >> 0x20),uVar19); (uVar10 & 1) == 0;
                  uVar10 = uVar10 >> 1 | 0x8000000000000000) {
                lVar20 = lVar20 + 1;
              }
              auVar38 = vpcmpeqd_avx2(ZEXT1632(auVar47),ZEXT1632(auVar47));
              auVar76 = ZEXT3264(auVar38);
              uStack_1388 = auVar92._8_8_;
              local_1390 = pSVar13;
              local_1270 = local_1340;
              do {
                uVar3 = *(uint *)(lVar23 + 0x120 + lVar20 * 4);
                pRVar11 = (RayHitK<8> *)(ulong)uVar3;
                pGVar5 = (pSVar13->geometries).items[(long)pRVar11].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  *(undefined4 *)(local_1340 + lVar20 * 4) = 0;
                  pSVar13 = local_1390;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar19 = *(undefined4 *)(local_1260 + lVar20 * 4);
                    uVar1 = *(undefined4 *)(local_1250 + lVar20 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1240 + lVar20 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_1230 + lVar20 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_1220 + lVar20 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_1210 + lVar20 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar19;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar1;
                    *(undefined4 *)(ray + k * 4 + 0x220) =
                         *(undefined4 *)(lVar23 + 0x130 + lVar20 * 4);
                    *(uint *)(ray + k * 4 + 0x240) = uVar3;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    unaff_R12 = local_1328;
                    break;
                  }
                  local_1060 = *(undefined4 *)(local_1260 + lVar20 * 4);
                  local_1040 = *(undefined4 *)(local_1250 + lVar20 * 4);
                  local_1020 = *(undefined4 *)(lVar23 + 0x130 + lVar20 * 4);
                  uVar19 = *(undefined4 *)(local_1230 + lVar20 * 4);
                  local_10c0._4_4_ = uVar19;
                  local_10c0._0_4_ = uVar19;
                  local_10c0._8_4_ = uVar19;
                  local_10c0._12_4_ = uVar19;
                  local_10c0._16_4_ = uVar19;
                  local_10c0._20_4_ = uVar19;
                  local_10c0._24_4_ = uVar19;
                  local_10c0._28_4_ = uVar19;
                  uVar19 = *(undefined4 *)(local_1220 + lVar20 * 4);
                  local_10a0._4_4_ = uVar19;
                  local_10a0._0_4_ = uVar19;
                  local_10a0._8_4_ = uVar19;
                  local_10a0._12_4_ = uVar19;
                  local_10a0._16_4_ = uVar19;
                  local_10a0._20_4_ = uVar19;
                  local_10a0._24_4_ = uVar19;
                  local_10a0._28_4_ = uVar19;
                  uVar19 = *(undefined4 *)(local_1210 + lVar20 * 4);
                  local_1080._4_4_ = uVar19;
                  local_1080._0_4_ = uVar19;
                  local_1080._8_4_ = uVar19;
                  local_1080._12_4_ = uVar19;
                  local_1080._16_4_ = uVar19;
                  local_1080._20_4_ = uVar19;
                  local_1080._24_4_ = uVar19;
                  local_1080._28_4_ = uVar19;
                  local_1000._4_4_ = uVar3;
                  local_1000._0_4_ = uVar3;
                  local_1000._8_4_ = uVar3;
                  local_1000._12_4_ = uVar3;
                  local_1000._16_4_ = uVar3;
                  local_1000._20_4_ = uVar3;
                  local_1000._24_4_ = uVar3;
                  local_1000._28_4_ = uVar3;
                  uStack_105c = local_1060;
                  uStack_1058 = local_1060;
                  uStack_1054 = local_1060;
                  uStack_1050 = local_1060;
                  uStack_104c = local_1060;
                  uStack_1048 = local_1060;
                  uStack_1044 = local_1060;
                  uStack_103c = local_1040;
                  uStack_1038 = local_1040;
                  uStack_1034 = local_1040;
                  uStack_1030 = local_1040;
                  uStack_102c = local_1040;
                  uStack_1028 = local_1040;
                  uStack_1024 = local_1040;
                  uStack_101c = local_1020;
                  uStack_1018 = local_1020;
                  uStack_1014 = local_1020;
                  uStack_1010 = local_1020;
                  uStack_100c = local_1020;
                  uStack_1008 = local_1020;
                  uStack_1004 = local_1020;
                  uStack_fdc = context->user->instID[0];
                  local_fe0 = uStack_fdc;
                  uStack_fd8 = uStack_fdc;
                  uStack_fd4 = uStack_fdc;
                  uStack_fd0 = uStack_fdc;
                  uStack_fcc = uStack_fdc;
                  uStack_fc8 = uStack_fdc;
                  uStack_fc4 = uStack_fdc;
                  uStack_fbc = context->user->instPrimID[0];
                  local_fc0 = uStack_fbc;
                  uStack_fb8 = uStack_fbc;
                  uStack_fb4 = uStack_fbc;
                  uStack_fb0 = uStack_fbc;
                  uStack_fac = uStack_fbc;
                  uStack_fa8 = uStack_fbc;
                  uStack_fa4 = uStack_fbc;
                  uVar19 = *(undefined4 *)(ray + k * 4 + 0x100);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1240 + lVar20 * 4);
                  local_1200 = local_10e0._0_8_;
                  uStack_11f8 = local_10e0._8_8_;
                  uStack_11f0 = local_10e0._16_8_;
                  uStack_11e8 = local_10e0._24_8_;
                  local_12f0 = &local_1200;
                  local_12e8 = pGVar5->userPtr;
                  local_12e0 = context->user;
                  local_12d0 = &local_10c0;
                  local_12c8 = 8;
                  pRVar11 = (RayHitK<8> *)pGVar5->intersectionFilterN;
                  local_12d8 = ray;
                  if (pRVar11 != (RayHitK<8> *)0x0) {
                    local_1380._0_8_ = lVar16;
                    local_1320._0_8_ = pauVar18;
                    local_1370 = lVar12;
                    local_1350 = auVar31._0_16_;
                    local_1360._0_4_ = uVar19;
                    auVar38 = ZEXT1632(auVar76._0_16_);
                    pRVar11 = (RayHitK<8> *)(*(code *)pRVar11)(&local_12f0);
                    auVar31 = ZEXT1664(local_1350);
                    auVar38 = vpcmpeqd_avx2(auVar38,auVar38);
                    auVar76 = ZEXT3264(auVar38);
                    lVar12 = local_1370;
                    uVar14 = local_1398;
                    lVar16 = local_1380._0_8_;
                    uVar17 = local_13a0;
                    ray = local_1330;
                    pauVar18 = (undefined1 (*) [16])local_1320._0_8_;
                    uVar19 = local_1360._0_4_;
                  }
                  auVar30._8_8_ = uStack_11f8;
                  auVar30._0_8_ = local_1200;
                  auVar30._16_8_ = uStack_11f0;
                  auVar30._24_8_ = uStack_11e8;
                  auVar30 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar30);
                  auVar38 = auVar76._0_32_ & ~auVar30;
                  if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar38 >> 0x7f,0) == '\0') &&
                        (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar38 >> 0xbf,0) == '\0') &&
                      (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar38[0x1f]) {
                    auVar30 = auVar30 ^ auVar76._0_32_;
                  }
                  else {
                    pRVar11 = (RayHitK<8> *)context->args->filter;
                    if ((pRVar11 != (RayHitK<8> *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      local_1380._0_8_ = lVar16;
                      local_1370 = lVar12;
                      local_1350 = auVar31._0_16_;
                      local_1360._0_4_ = uVar19;
                      auVar38 = ZEXT1632(auVar76._0_16_);
                      pRVar11 = (RayHitK<8> *)(*(code *)pRVar11)(&local_12f0);
                      auVar31 = ZEXT1664(local_1350);
                      auVar38 = vpcmpeqd_avx2(auVar38,auVar38);
                      auVar76 = ZEXT3264(auVar38);
                      lVar12 = local_1370;
                      uVar14 = local_1398;
                      lVar16 = local_1380._0_8_;
                      uVar17 = local_13a0;
                      ray = local_1330;
                      uVar19 = local_1360._0_4_;
                    }
                    auVar6._8_8_ = uStack_11f8;
                    auVar6._0_8_ = local_1200;
                    auVar6._16_8_ = uStack_11f0;
                    auVar6._24_8_ = uStack_11e8;
                    auVar6 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar6);
                    auVar30 = auVar6 ^ auVar76._0_32_;
                    auVar38 = auVar76._0_32_ & ~auVar6;
                    if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar38 >> 0x7f,0) != '\0') ||
                          (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar38 >> 0xbf,0) != '\0') ||
                        (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar38[0x1f] < '\0') {
                      auVar39._0_4_ = auVar6._0_4_ ^ auVar76._0_4_;
                      auVar39._4_4_ = auVar6._4_4_ ^ auVar76._4_4_;
                      auVar39._8_4_ = auVar6._8_4_ ^ auVar76._8_4_;
                      auVar39._12_4_ = auVar6._12_4_ ^ auVar76._12_4_;
                      auVar39._16_4_ = auVar6._16_4_ ^ auVar76._16_4_;
                      auVar39._20_4_ = auVar6._20_4_ ^ auVar76._20_4_;
                      auVar39._24_4_ = auVar6._24_4_ ^ auVar76._24_4_;
                      auVar39._28_4_ = auVar6._28_4_ ^ auVar76._28_4_;
                      auVar38 = vmaskmovps_avx(auVar39,*local_12d0);
                      *(undefined1 (*) [32])(local_12d8 + 0x180) = auVar38;
                      auVar38 = vmaskmovps_avx(auVar39,local_12d0[1]);
                      *(undefined1 (*) [32])(local_12d8 + 0x1a0) = auVar38;
                      auVar38 = vmaskmovps_avx(auVar39,local_12d0[2]);
                      *(undefined1 (*) [32])(local_12d8 + 0x1c0) = auVar38;
                      auVar38 = vmaskmovps_avx(auVar39,local_12d0[3]);
                      *(undefined1 (*) [32])(local_12d8 + 0x1e0) = auVar38;
                      auVar38 = vmaskmovps_avx(auVar39,local_12d0[4]);
                      *(undefined1 (*) [32])(local_12d8 + 0x200) = auVar38;
                      auVar38 = vpmaskmovd_avx2(auVar39,local_12d0[5]);
                      *(undefined1 (*) [32])(local_12d8 + 0x220) = auVar38;
                      auVar38 = vpmaskmovd_avx2(auVar39,local_12d0[6]);
                      *(undefined1 (*) [32])(local_12d8 + 0x240) = auVar38;
                      auVar38 = vpmaskmovd_avx2(auVar39,local_12d0[7]);
                      *(undefined1 (*) [32])(local_12d8 + 0x260) = auVar38;
                      auVar38 = vpmaskmovd_avx2(auVar39,local_12d0[8]);
                      *(undefined1 (*) [32])(local_12d8 + 0x280) = auVar38;
                      pRVar11 = local_12d8;
                    }
                  }
                  if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar30 >> 0x7f,0) == '\0') &&
                        (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar30 >> 0xbf,0) == '\0') &&
                      (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar30[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar19;
                  }
                  *(undefined4 *)(local_1340 + lVar20 * 4) = 0;
                  uVar19 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar29._4_4_ = uVar19;
                  auVar29._0_4_ = uVar19;
                  auVar29._8_4_ = uVar19;
                  auVar29._12_4_ = uVar19;
                  auVar34 = vcmpps_avx(auVar31._0_16_,auVar29,2);
                  local_1340 = vandps_avx(auVar34,local_1340);
                  pSVar13 = local_1390;
                }
                unaff_R12 = local_1328;
                if ((((local_1340 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_1340 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_1340 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_1340[0xf]) break;
                auVar37._8_4_ = 0x7f800000;
                auVar37._0_8_ = 0x7f8000007f800000;
                auVar37._12_4_ = 0x7f800000;
                auVar34 = vblendvps_avx(auVar37,auVar31._0_16_,local_1340);
                auVar33 = vshufps_avx(auVar34,auVar34,0xb1);
                auVar33 = vminps_avx(auVar33,auVar34);
                auVar47 = vshufpd_avx(auVar33,auVar33,1);
                auVar33 = vminps_avx(auVar47,auVar33);
                auVar33 = vcmpps_avx(auVar34,auVar33,0);
                auVar47 = local_1340 & auVar33;
                auVar34 = local_1340;
                if ((((auVar47 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar47[0xf] < '\0') {
                  auVar34 = vandps_avx(auVar33,local_1340);
                }
                uVar19 = vmovmskps_avx(auVar34);
                lVar20 = 0;
                for (uVar10 = CONCAT44((int)((ulong)pRVar11 >> 0x20),uVar19); (uVar10 & 1) == 0;
                    uVar10 = uVar10 >> 1 | 0x8000000000000000) {
                  lVar20 = lVar20 + 1;
                }
              } while( true );
            }
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != lVar12);
    }
    uVar19 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar31 = ZEXT1664(CONCAT412(uVar19,CONCAT48(uVar19,CONCAT44(uVar19,uVar19))));
    auVar81 = ZEXT1664(local_1160);
    auVar83 = ZEXT1664(local_1170);
    auVar84 = ZEXT1664(local_1180);
    auVar76 = ZEXT1664(local_12c0);
    uVar10 = local_1308;
    uVar22 = local_1310;
    fVar85 = local_1190;
    fVar88 = fStack_118c;
    fVar89 = fStack_1188;
    fVar90 = fStack_1184;
    fVar91 = local_11a0;
    fVar93 = fStack_119c;
    fVar94 = fStack_1198;
    fVar95 = fStack_1194;
    fVar96 = local_11b0;
    fVar97 = fStack_11ac;
    fVar98 = fStack_11a8;
    fVar99 = fStack_11a4;
    fVar100 = local_11c0;
    fVar103 = fStack_11bc;
    fVar104 = fStack_11b8;
    fVar105 = fStack_11b4;
    fVar106 = local_11d0;
    fVar108 = fStack_11cc;
    fVar109 = fStack_11c8;
    fVar110 = fStack_11c4;
    fVar111 = local_11e0;
    fVar112 = fStack_11dc;
    fVar113 = fStack_11d8;
    fVar114 = fStack_11d4;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }